

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc.c
# Opt level: O2

void etdc_gencodes(etdc_table *table)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  
  iVar4 = 0;
  lVar5 = 1;
  iVar6 = 0x80;
  iVar7 = 0;
  while (table != (etdc_table *)0x0) {
    iVar2 = 0;
    while ((table != (etdc_table *)0x0 && (iVar2 < iVar6))) {
      table->code[lVar5 + -1] = (char)(iVar2 % 0x80) + 0x80;
      for (uVar3 = (int)lVar5 - 2; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
        lVar1 = (long)iVar2;
        iVar2 = (int)(lVar1 / 0x80);
        table->code[uVar3] =
             (uchar)((long)((ulong)(uint)(iVar2 >> 0x1f) << 0x20 | lVar1 / 0x80 & 0xffffffffU) %
                    0x80);
      }
      table->size = (int)lVar5;
      iVar7 = iVar7 + 1;
      table = (etdc_table *)(table->hh).next;
      iVar2 = iVar7 - iVar4;
    }
    lVar5 = lVar5 + 1;
    iVar4 = iVar4 + iVar6;
    iVar6 = iVar6 << 7;
  }
  return;
}

Assistant:

void etdc_gencodes(struct etdc_table *table) {
  struct etdc_table *s;
  int paux;
  int first;
  int num;
  int p;
  int i,k;
  first = 0;
  num = 128;
  k = 1;
  p = 0;
  for(s=table; s != NULL;) {
    paux = 0;

    for(; (s != (struct etdc_table*)NULL) && (paux < num); s=(struct etdc_table*)s->hh.next) {
      s->code[k - 1] = 128 + paux % 128;
      paux = paux / 128;

      for( i = k -2; i >= 0; i--) {
	s->code[i] = paux % 128;
	paux = paux / 128;
      }
      s->size = k;

      p++;
      paux = p - first;
    }
    k++;
    first = first + num;
    num = num*128;
  }

}